

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int fts3SegReaderCursorAppend(Fts3MultiSegReader *pCsr,Fts3SegReader *pNew)

{
  int iVar1;
  Fts3SegReader **pOld;
  uint uVar2;
  
  uVar2 = pCsr->nSegment;
  pOld = pCsr->apSegment;
  if ((uVar2 & 0xf) == 0) {
    iVar1 = sqlite3_initialize();
    if (iVar1 == 0) {
      pOld = (Fts3SegReader **)sqlite3Realloc(pOld,(long)(int)uVar2 * 8 + 0x80);
      if (pOld != (Fts3SegReader **)0x0) {
        pCsr->apSegment = pOld;
        uVar2 = pCsr->nSegment;
        goto LAB_001b52c0;
      }
    }
    sqlite3Fts3SegReaderFree(pNew);
    iVar1 = 7;
  }
  else {
LAB_001b52c0:
    pCsr->nSegment = uVar2 + 1;
    pOld[(int)uVar2] = pNew;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

static int fts3SegReaderCursorAppend(
  Fts3MultiSegReader *pCsr, 
  Fts3SegReader *pNew
){
  if( (pCsr->nSegment%16)==0 ){
    Fts3SegReader **apNew;
    sqlite3_int64 nByte = (pCsr->nSegment + 16)*sizeof(Fts3SegReader*);
    apNew = (Fts3SegReader **)sqlite3_realloc64(pCsr->apSegment, nByte);
    if( !apNew ){
      sqlite3Fts3SegReaderFree(pNew);
      return SQLITE_NOMEM;
    }
    pCsr->apSegment = apNew;
  }
  pCsr->apSegment[pCsr->nSegment++] = pNew;
  return SQLITE_OK;
}